

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_classify_nosse2.cpp
# Opt level: O1

int ClassifyLine2(node_t *node,FSimpleVert *v1,FSimpleVert *v2,int *sidev)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar10 = (double)node->dx;
  dVar9 = (double)node->dy;
  dVar8 = ((double)node->y - (double)v1->y) * dVar10 - ((double)node->x - (double)v1->x) * dVar9;
  dVar7 = ((double)node->y - (double)v2->y) * dVar10 - ((double)node->x - (double)v2->x) * dVar9;
  if (dVar8 <= -17179869184.0) {
    if (dVar7 <= -17179869184.0) {
      sidev[0] = 1;
      sidev[1] = 1;
      return 1;
    }
    bVar2 = true;
    bVar3 = false;
    if (17179869184.0 <= dVar7) {
      uVar4 = 0xffffffff00000001;
LAB_004cadae:
      *(undefined8 *)sidev = uVar4;
      return -1;
    }
  }
  else if (17179869184.0 <= dVar8) {
    if (17179869184.0 <= dVar7) {
      sidev[0] = -1;
      sidev[1] = -1;
      return 0;
    }
    bVar2 = true;
    bVar3 = false;
    if (dVar7 <= -17179869184.0) {
      uVar4 = 0x1ffffffff;
      goto LAB_004cadae;
    }
  }
  else {
    bVar2 = ABS(dVar7) < 17179869184.0;
    bVar3 = true;
  }
  dVar9 = 1.0 / (dVar9 * dVar9 + dVar10 * dVar10);
  if (bVar3) {
    uVar5 = ((dVar8 <= 0.0) - 1) + (uint)(dVar8 <= 0.0);
    if (dVar8 * dVar8 * dVar9 < 42.94967296) {
      uVar5 = 0;
    }
  }
  else {
    uVar5 = (uint)(dVar8 <= 0.0) * 2 - 1;
  }
  *sidev = uVar5;
  if ((!bVar2) || (uVar6 = 0, 42.94967296 <= dVar9 * dVar7 * dVar7)) {
    uVar6 = (uint)(dVar7 <= 0.0) * 2 - 1;
  }
  sidev[1] = uVar6;
  if ((uVar6 | uVar5) == 0) {
    iVar1 = node->dx;
    if (iVar1 == 0) {
      if ((node->dy < 1) || (v2->y <= v1->y)) {
        if (-1 < node->dy) {
          return 1;
        }
        if (v1->y <= v2->y) {
          return 1;
        }
      }
    }
    else if (((iVar1 < 1) || (v2->x <= v1->x)) && ((-1 < iVar1 || (v1->x <= v2->x)))) {
      return 1;
    }
  }
  else if ((0 < (int)uVar5) || (0 < (int)uVar6)) {
    return (int)(uVar6 | uVar5) >> 0x1f | 1;
  }
  return 0;
}

Assistant:

int ClassifyLine2 (node_t &node, const FSimpleVert *v1, const FSimpleVert *v2, int sidev[2])
{
	double d_x1 = double(node.x);
	double d_y1 = double(node.y);
	double d_dx = double(node.dx);
	double d_dy = double(node.dy);
	double d_xv1 = double(v1->x);
	double d_xv2 = double(v2->x);
	double d_yv1 = double(v1->y);
	double d_yv2 = double(v2->y);

	double s_num1 = (d_y1 - d_yv1) * d_dx - (d_x1 - d_xv1) * d_dy;
	double s_num2 = (d_y1 - d_yv2) * d_dx - (d_x1 - d_xv2) * d_dy;

	int nears = 0;

	if (s_num1 <= -FAR_ENOUGH)
	{
		if (s_num2 <= -FAR_ENOUGH)
		{
			sidev[0] = sidev[1] = 1;
			return 1;
		}
		if (s_num2 >= FAR_ENOUGH)
		{
			sidev[0] = 1;
			sidev[1] = -1;
			return -1;
		}
		nears = 1;
	}
	else if (s_num1 >= FAR_ENOUGH)
	{
		if (s_num2 >= FAR_ENOUGH)
		{
			sidev[0] = sidev[1] = -1;
			return 0;
		}
		if (s_num2 <= -FAR_ENOUGH)
		{
			sidev[0] = -1;
			sidev[1] = 1;
			return -1;
		}
		nears = 1;
	}
	else
	{
		nears = 2 | int(fabs(s_num2) < FAR_ENOUGH);
	}

	if (nears)
	{
		double l = 1.f / (d_dx*d_dx + d_dy*d_dy);
		if (nears & 2)
		{
			double dist = s_num1 * s_num1 * l;
			if (dist < SIDE_EPSILON*SIDE_EPSILON)
			{
				sidev[0] = 0;
			}
			else
			{
				sidev[0] = s_num1 > 0.0 ? -1 : 1;
			}
		}
		else
		{
			sidev[0] = s_num1 > 0.0 ? -1 : 1;
		}
		if (nears & 1)
		{
			double dist = s_num2 * s_num2 * l;
			if (dist < SIDE_EPSILON*SIDE_EPSILON)
			{
				sidev[1] = 0;
			}
			else
			{
				sidev[1] = s_num2 > 0.0 ? -1 : 1;
			}
		}
		else
		{
			sidev[1] = s_num2 > 0.0 ? -1 : 1;
		}
	}
	else
	{
		sidev[0] = s_num1 > 0.0 ? -1 : 1;
		sidev[1] = s_num2 > 0.0 ? -1 : 1;
	}

	if ((sidev[0] | sidev[1]) == 0)
	{ // seg is coplanar with the splitter, so use its orientation to determine
	  // which child it ends up in. If it faces the same direction as the splitter,
	  // it goes in front. Otherwise, it goes in back.

		if (node.dx != 0)
		{
			if ((node.dx > 0 && v2->x > v1->x) || (node.dx < 0 && v2->x < v1->x))
			{
				return 0;
			}
			else
			{
				return 1;
			}
		}
		else
		{
			if ((node.dy > 0 && v2->y > v1->y) || (node.dy < 0 && v2->y < v1->y))
			{
				return 0;
			}
			else
			{
				return 1;
			}
		}
	}
	else if (sidev[0] <= 0 && sidev[1] <= 0)
	{
		return 0;
	}
	else if (sidev[0] >= 0 && sidev[1] >= 0)
	{
		return 1;
	}
	return -1;
}